

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

void tcu::estimatePixelValueRange(ConstPixelBufferAccess *access,Vec4 *minVal,Vec4 *maxVal)

{
  int i;
  TextureChannelClass TVar1;
  long lVar2;
  int iVar3;
  int y;
  int z;
  uint uVar4;
  uint uVar5;
  float fVar6;
  Vec4 p;
  float local_40 [4];
  
  TVar1 = getTextureChannelClass((access->m_format).type);
  if (TVar1 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
    lVar2 = 0;
    do {
      local_40[lVar2] = -1.0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    *(ulong *)minVal->m_data = CONCAT44(local_40[1],local_40[0]);
    *(ulong *)(minVal->m_data + 2) = CONCAT44(local_40[3],local_40[2]);
    lVar2 = 0;
    do {
      local_40[lVar2] = 1.0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  else {
    if (TVar1 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      lVar2 = 0;
      do {
        local_40[lVar2] = 3.4028235e+38;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      *(ulong *)minVal->m_data = CONCAT44(local_40[1],local_40[0]);
      *(ulong *)(minVal->m_data + 2) = CONCAT44(local_40[3],local_40[2]);
      lVar2 = 0;
      do {
        local_40[lVar2] = 1.1754944e-38;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      *(ulong *)maxVal->m_data = CONCAT44(local_40[1],local_40[0]);
      *(ulong *)(maxVal->m_data + 2) = CONCAT44(local_40[3],local_40[2]);
      if ((access->m_size).m_data[2] < 1) {
        return;
      }
      iVar3 = 0;
      do {
        if (0 < (access->m_size).m_data[1]) {
          z = 0;
          do {
            if (0 < (access->m_size).m_data[0]) {
              y = 0;
              do {
                ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_40,(int)access,y,z)
                ;
                fVar6 = minVal->m_data[0];
                uVar4 = -(uint)(!NAN(local_40[0]) && !NAN(local_40[0]));
                minVal->m_data[0] =
                     (float)(~uVar4 & (uint)fVar6 |
                            (~-(uint)(fVar6 <= local_40[0]) & (uint)local_40[0] |
                            -(uint)(fVar6 <= local_40[0]) & (uint)fVar6) & uVar4);
                if (NAN(local_40[1])) {
                  fVar6 = minVal->m_data[1];
                }
                else {
                  uVar5 = -(uint)(minVal->m_data[1] <= local_40[1]);
                  fVar6 = (float)(~uVar5 & (uint)local_40[1] | (uint)minVal->m_data[1] & uVar5);
                }
                minVal->m_data[1] = fVar6;
                if (NAN(local_40[2])) {
                  fVar6 = minVal->m_data[2];
                }
                else {
                  uVar5 = -(uint)(minVal->m_data[2] <= local_40[2]);
                  fVar6 = (float)(~uVar5 & (uint)local_40[2] | (uint)minVal->m_data[2] & uVar5);
                }
                minVal->m_data[2] = fVar6;
                if (NAN(local_40[3])) {
                  fVar6 = minVal->m_data[3];
                }
                else {
                  uVar5 = -(uint)(minVal->m_data[3] <= local_40[3]);
                  fVar6 = (float)(~uVar5 & (uint)local_40[3] | (uint)minVal->m_data[3] & uVar5);
                }
                minVal->m_data[3] = fVar6;
                fVar6 = maxVal->m_data[0];
                maxVal->m_data[0] =
                     (float)(~uVar4 & (uint)fVar6 |
                            (~-(uint)(local_40[0] <= fVar6) & (uint)local_40[0] |
                            -(uint)(local_40[0] <= fVar6) & (uint)fVar6) & uVar4);
                if (NAN(local_40[1])) {
                  fVar6 = maxVal->m_data[1];
                }
                else {
                  uVar4 = -(uint)(local_40[1] <= maxVal->m_data[1]);
                  fVar6 = (float)(~uVar4 & (uint)local_40[1] | (uint)maxVal->m_data[1] & uVar4);
                }
                maxVal->m_data[1] = fVar6;
                if (NAN(local_40[2])) {
                  fVar6 = maxVal->m_data[2];
                }
                else {
                  uVar4 = -(uint)(local_40[2] <= maxVal->m_data[2]);
                  fVar6 = (float)(~uVar4 & (uint)local_40[2] | (uint)maxVal->m_data[2] & uVar4);
                }
                maxVal->m_data[2] = fVar6;
                if (NAN(local_40[3])) {
                  fVar6 = maxVal->m_data[3];
                }
                else {
                  uVar4 = -(uint)(local_40[3] <= maxVal->m_data[3]);
                  fVar6 = (float)(~uVar4 & (uint)local_40[3] | (uint)maxVal->m_data[3] & uVar4);
                }
                maxVal->m_data[3] = fVar6;
                y = y + 2;
              } while (y < (access->m_size).m_data[0]);
            }
            z = z + 2;
          } while (z < (access->m_size).m_data[1]);
        }
        iVar3 = iVar3 + 2;
      } while (iVar3 < (access->m_size).m_data[2]);
      return;
    }
    minVal->m_data[0] = 0.0;
    minVal->m_data[1] = 0.0;
    minVal->m_data[2] = 0.0;
    minVal->m_data[3] = 0.0;
    lVar2 = 0;
    do {
      local_40[lVar2] = 1.0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  *(ulong *)maxVal->m_data = CONCAT44(local_40[1],local_40[0]);
  *(ulong *)(maxVal->m_data + 2) = CONCAT44(local_40[3],local_40[2]);
  return;
}

Assistant:

void estimatePixelValueRange (const ConstPixelBufferAccess& access, Vec4& minVal, Vec4& maxVal)
{
	const TextureFormat& format = access.getFormat();

	switch (getTextureChannelClass(format.type))
	{
		case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			// Normalized unsigned formats.
			minVal = Vec4(0.0f);
			maxVal = Vec4(1.0f);
			break;

		case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
			// Normalized signed formats.
			minVal = Vec4(-1.0f);
			maxVal = Vec4(+1.0f);
			break;

		default:
			// \note Samples every 4/8th pixel.
			minVal = Vec4(std::numeric_limits<float>::max());
			maxVal = Vec4(std::numeric_limits<float>::min());

			for (int z = 0; z < access.getDepth(); z += 2)
			{
				for (int y = 0; y < access.getHeight(); y += 2)
				{
					for (int x = 0; x < access.getWidth(); x += 2)
					{
						Vec4 p = access.getPixel(x, y, z);

						minVal[0] = (deFloatIsNaN(p[0]) ? minVal[0] : de::min(minVal[0], p[0]));
						minVal[1] = (deFloatIsNaN(p[1]) ? minVal[1] : de::min(minVal[1], p[1]));
						minVal[2] = (deFloatIsNaN(p[2]) ? minVal[2] : de::min(minVal[2], p[2]));
						minVal[3] = (deFloatIsNaN(p[3]) ? minVal[3] : de::min(minVal[3], p[3]));

						maxVal[0] = (deFloatIsNaN(p[0]) ? maxVal[0] : de::max(maxVal[0], p[0]));
						maxVal[1] = (deFloatIsNaN(p[1]) ? maxVal[1] : de::max(maxVal[1], p[1]));
						maxVal[2] = (deFloatIsNaN(p[2]) ? maxVal[2] : de::max(maxVal[2], p[2]));
						maxVal[3] = (deFloatIsNaN(p[3]) ? maxVal[3] : de::max(maxVal[3], p[3]));
					}
				}
			}
			break;
	}
}